

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var Js::JavascriptArray::EntryReduceRight(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  ThreadContext *pTVar2;
  code *pcVar3;
  CallInfo pArr_00;
  JavascriptArray *obj_00;
  bool bVar4;
  bool bVar5;
  uint32 length_00;
  undefined4 *puVar6;
  Var pvVar7;
  uint64 length_01;
  int in_stack_00000010;
  undefined1 local_b0 [8];
  AutoTagNativeLibraryEntry __tag;
  ArgumentReader args;
  JsReentLock jsReentLock;
  BigIndex length;
  CallInfo callInfo_local;
  JavascriptArray *pArr;
  RecyclableObject *obj;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  length.bigIndex = (uint64)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x27e9,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00b8109d;
    *puVar6 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  __tag.entry.next = (Entry *)callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)&__tag.entry.next,(CallInfo *)&length.bigIndex);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  pTVar2 = pSVar1->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  bVar4 = pTVar2->noJsReentrancy;
  pTVar2->noJsReentrancy = true;
  args.super_Arguments.Values = (Type)pTVar2;
  jsReentLock.m_arrayObject2._0_1_ = bVar4;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_b0,function,(CallInfo)length.bigIndex,
             L"Array.prototype.reduceRight",&stack0x00000000);
  if ((length.bigIndex & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x27f1,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar5) {
LAB_00b8109d:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  if (((ulong)__tag.entry.next & 0xffffff) != 0) {
    BigIndex::BigIndex((BigIndex *)&jsReentLock.m_savedNoJsReentrancy,0);
    callInfo_local = (CallInfo)0x0;
    pArr = (JavascriptArray *)0x0;
    pTVar2->noJsReentrancy = bVar4;
    pvVar7 = Arguments::operator[]((Arguments *)&__tag.entry.next,0);
    TryGetArrayAndLength<Js::JavascriptArray::BigIndex>
              (pvVar7,pSVar1,L"Array.prototype.reduceRight",(JavascriptArray **)&callInfo_local,
               (RecyclableObject **)&pArr,(BigIndex *)&jsReentLock.m_savedNoJsReentrancy);
    JsReentLock::MutateArrayObject((JsReentLock *)&args.super_Arguments.Values);
    obj_00 = pArr;
    pArr_00 = callInfo_local;
    *(undefined1 *)(args.super_Arguments.Values + 0x21) = 1;
    *(undefined1 *)(args.super_Arguments.Values + 0x21) = jsReentLock.m_arrayObject2._0_1_;
    if (jsReentLock._24_4_ == -1) {
      length_01 = BigIndex::GetBigIndex((BigIndex *)&jsReentLock.m_savedNoJsReentrancy);
      pvVar7 = ReduceRightHelper<unsigned_long>
                         ((JavascriptArray *)pArr_00,(TypedArrayBase *)0x0,
                          (RecyclableObject *)obj_00,length_01,(Arguments *)&__tag.entry.next,pSVar1
                         );
    }
    else {
      length_00 = BigIndex::GetSmallIndex((BigIndex *)&jsReentLock.m_savedNoJsReentrancy);
      pvVar7 = ReduceRightHelper<unsigned_int>
                         ((JavascriptArray *)pArr_00,(TypedArrayBase *)0x0,
                          (RecyclableObject *)obj_00,length_00,(Arguments *)&__tag.entry.next,pSVar1
                         );
    }
    AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_b0);
    *(undefined1 *)(args.super_Arguments.Values + 0x21) = jsReentLock.m_arrayObject2._0_1_;
    return pvVar7;
  }
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec42,L"Array.prototype.reduceRight");
}

Assistant:

Var JavascriptArray::EntryReduceRight(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());

        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Array.prototype.reduceRight"));

        CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(Array_Prototype_reduceRight);

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Array.prototype.reduceRight"));
        }

        BigIndex length;
        JavascriptArray * pArr = nullptr;
        RecyclableObject* obj = nullptr;
        JS_REENTRANT(jsReentLock, TryGetArrayAndLength(args[0], scriptContext, _u("Array.prototype.reduceRight"), &pArr, &obj, &length));

        if (length.IsSmallIndex())
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::ReduceRightHelper(pArr, nullptr, obj, length.GetSmallIndex(), args, scriptContext));
        }

        JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::ReduceRightHelper(pArr, nullptr, obj, length.GetBigIndex(), args, scriptContext));
    }